

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

void duckdb::ZSTDStorage::CleanupState(ColumnSegment *segment)

{
  _func_int **pp_Var1;
  CompressedSegmentState *pCVar2;
  BlockManager *pBVar3;
  long *block_id;
  _func_int **pp_Var4;
  _Head_base<0UL,_duckdb::CompressedSegmentState_*,_false> local_20;
  
  local_20._M_head_impl =
       (segment->segment_state).
       super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
       .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
  pCVar2 = optional_ptr<duckdb::CompressedSegmentState,_true>::operator->
                     ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_20);
  pBVar3 = ColumnSegment::GetBlockManager(segment);
  pp_Var1 = pCVar2[0xc]._vptr_CompressedSegmentState;
  for (pp_Var4 = pCVar2[0xb]._vptr_CompressedSegmentState; pp_Var4 != pp_Var1; pp_Var4 = pp_Var4 + 1
      ) {
    (*pBVar3->_vptr_BlockManager[9])(pBVar3,*pp_Var4);
  }
  return;
}

Assistant:

void ZSTDStorage::CleanupState(ColumnSegment &segment) {
	auto &state = segment.GetSegmentState()->Cast<UncompressedStringSegmentState>();
	auto &block_manager = segment.GetBlockManager();
	for (auto &block_id : state.on_disk_blocks) {
		block_manager.MarkBlockAsModified(block_id);
	}
}